

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

void setupCornellBox(World *world)

{
  pointer __p;
  Sampler *pSVar1;
  Matte *pMVar2;
  Rectangle *pRVar3;
  Geometry *local_2f0;
  float local_2e8;
  Vector3 local_2e0;
  Geometry *local_2d0;
  float local_2c8;
  Geometry *local_2c0;
  float local_2b8;
  _Head_base<0UL,_pm::Geometry_*,_false> local_2b0;
  _Head_base<0UL,_pm::Geometry_*,_false> local_2a8;
  _Head_base<0UL,_pm::Geometry_*,_false> local_2a0;
  _Head_base<0UL,_pm::Geometry_*,_false> local_298;
  _Head_base<0UL,_pm::Geometry_*,_false> local_290;
  _Head_base<0UL,_pm::Geometry_*,_false> local_288;
  _Head_base<0UL,_pm::Geometry_*,_false> local_280;
  _Head_base<0UL,_pm::Geometry_*,_false> local_278;
  _Head_base<0UL,_pm::Geometry_*,_false> local_270;
  Matte *local_268;
  _Head_base<0UL,_pm::Geometry_*,_false> local_260;
  Geometry *local_258;
  Geometry *local_250;
  Emissive *local_248;
  Matte *local_240;
  Matte *local_238;
  Geometry *local_230;
  Geometry *local_228;
  Geometry *local_220;
  Geometry *local_218;
  undefined8 local_210;
  undefined4 local_208;
  Vector3 local_200;
  Vector3 local_1f0;
  undefined8 local_1e0;
  undefined4 local_1d8;
  Vector3 local_1d0;
  Vector3 local_1c0;
  undefined8 local_1b0;
  undefined4 local_1a8;
  Vector3 local_1a0;
  Vector3 local_190;
  undefined8 local_180;
  undefined4 local_178;
  Vector3 local_170;
  Vector3 local_160;
  undefined8 local_150;
  undefined4 local_148;
  Vector3 local_140;
  Vector3 local_130;
  undefined8 local_120;
  undefined4 local_118;
  Vector3 local_110;
  Vector3 local_100;
  undefined8 local_f0;
  undefined4 local_e8;
  Vector3 local_e0;
  Vector3 local_d0;
  undefined8 local_c0;
  undefined4 local_b8;
  Vector3 local_b0;
  Vector3 local_a0;
  undefined8 local_90;
  undefined4 local_88;
  Vector3 local_80;
  Vector3 local_70;
  undefined8 local_60;
  undefined4 local_58;
  Vector3 local_50;
  Vector3 local_40;
  
  local_2e0.x = 1.26117e-44;
  pSVar1 = &pm::World::createSampler<pm::MultiJittered,int>(world,(int *)&local_2e0)->super_Sampler;
  (world->viewplane_).width_ = 0x500;
  (world->viewplane_).height_ = 0x2d0;
  (world->viewplane_).samplerState_.sampler_ = pSVar1;
  (world->viewplane_).maxDepth_ = 5;
  local_2e0.x = 3.58732e-43;
  pSVar1 = &pm::World::createSampler<pm::Hammersley,int>(world,(int *)&local_2e0)->super_Sampler;
  pMVar2 = pm::World::createMaterial<pm::Matte>(world);
  local_268 = pMVar2;
  pm::Matte::setCd(pMVar2,0.7,0.7,0.7);
  pm::BRDF::setSampler(&(pMVar2->ambientBrdf_).super_BRDF,pSVar1);
  pm::BRDF::setSampler(&(pMVar2->diffuseBrdf_).super_BRDF,pSVar1);
  pMVar2 = pm::World::createMaterial<pm::Matte>(world);
  local_238 = pMVar2;
  pm::Matte::setCd(pMVar2,0.7,0.0,0.0);
  pm::BRDF::setSampler(&(pMVar2->ambientBrdf_).super_BRDF,pSVar1);
  pm::BRDF::setSampler(&(pMVar2->diffuseBrdf_).super_BRDF,pSVar1);
  pMVar2 = pm::World::createMaterial<pm::Matte>(world);
  local_240 = pMVar2;
  pm::Matte::setCd(pMVar2,0.0,0.7,0.0);
  pm::BRDF::setSampler(&(pMVar2->ambientBrdf_).super_BRDF,pSVar1);
  pm::BRDF::setSampler(&(pMVar2->diffuseBrdf_).super_BRDF,pSVar1);
  local_248 = pm::World::createMaterial<pm::Emissive>(world);
  local_2e0.x = 213.0;
  local_2e0.y = 548.79;
  local_2e0.z = 227.0;
  local_2c0 = (Geometry *)0x43020000;
  local_2b8 = 0.0;
  local_2d0 = (Geometry *)0x0;
  local_2c8 = 105.0;
  local_2f0 = (Geometry *)0xbf80000000000000;
  local_2e8 = 0.0;
  pRVar3 = pm::World::createObject<pm::Rectangle,pm::Vector3,pm::Vector3,pm::Vector3,pm::Vector3>
                     (world,&local_2e0,(Vector3 *)&local_2c0,(Vector3 *)&local_2d0,
                      (Vector3 *)&local_2f0);
  (pRVar3->samplerState_).sampler_ = pSVar1;
  (pRVar3->super_Geometry).material_ = &local_248->super_Material;
  local_2e0.x = 0.0;
  local_2e0.y = 0.0;
  local_2e0.z = 0.0;
  local_2c0 = (Geometry *)0x440a3333;
  local_2b8 = 0.0;
  local_2d0 = (Geometry *)0x0;
  local_2c8 = 559.2;
  local_2f0 = (Geometry *)0x3f80000000000000;
  local_2e8 = 0.0;
  pRVar3 = pm::World::createObject<pm::Rectangle,pm::Vector3,pm::Vector3,pm::Vector3,pm::Vector3>
                     (world,&local_2e0,(Vector3 *)&local_2c0,(Vector3 *)&local_2d0,
                      (Vector3 *)&local_2f0);
  pMVar2 = local_268;
  (pRVar3->super_Geometry).material_ = &local_268->super_Material;
  local_2e0._0_8_ = &DAT_4409333300000000;
  local_2e0.z = 0.0;
  local_2c0 = (Geometry *)&DAT_440b0000;
  local_2b8 = 0.0;
  local_2d0 = (Geometry *)0x0;
  local_2c8 = 559.2;
  local_2f0 = (Geometry *)0xbf80000000000000;
  local_2e8 = 0.0;
  pRVar3 = pm::World::createObject<pm::Rectangle,pm::Vector3,pm::Vector3,pm::Vector3,pm::Vector3>
                     (world,&local_2e0,(Vector3 *)&local_2c0,(Vector3 *)&local_2d0,
                      (Vector3 *)&local_2f0);
  (pRVar3->super_Geometry).material_ = &pMVar2->super_Material;
  local_2e0.x = 552.8;
  local_2e0.y = 0.0;
  local_2e0.z = 0.0;
  local_2c0 = (Geometry *)&DAT_4409333300000000;
  local_2b8 = 0.0;
  local_2d0 = (Geometry *)0x0;
  local_2c8 = 559.2;
  local_2f0 = (Geometry *)0xbf800000;
  local_2e8 = 0.0;
  pRVar3 = pm::World::createObject<pm::Rectangle,pm::Vector3,pm::Vector3,pm::Vector3,pm::Vector3>
                     (world,&local_2e0,(Vector3 *)&local_2c0,(Vector3 *)&local_2d0,
                      (Vector3 *)&local_2f0);
  (pRVar3->super_Geometry).material_ = &local_238->super_Material;
  local_2e0.x = 0.0;
  local_2e0.y = 0.0;
  local_2e0.z = 0.0;
  local_2c0 = (Geometry *)&DAT_4409333300000000;
  local_2b8 = 0.0;
  local_2d0 = (Geometry *)0x0;
  local_2c8 = 559.2;
  local_2f0 = (Geometry *)0x3f800000;
  local_2e8 = 0.0;
  pRVar3 = pm::World::createObject<pm::Rectangle,pm::Vector3,pm::Vector3,pm::Vector3,pm::Vector3>
                     (world,&local_2e0,(Vector3 *)&local_2c0,(Vector3 *)&local_2d0,
                      (Vector3 *)&local_2f0);
  pMVar2 = local_268;
  (pRVar3->super_Geometry).material_ = &local_240->super_Material;
  local_2e0._0_8_ = (Geometry *)0x0;
  local_2e0.z = 559.2;
  local_2c0 = (Geometry *)&DAT_4409333300000000;
  local_2b8 = 0.0;
  local_2d0 = (Geometry *)&DAT_440b0000;
  local_2c8 = 0.0;
  local_2f0 = (Geometry *)0x0;
  local_2e8 = -1.0;
  pRVar3 = pm::World::createObject<pm::Rectangle,pm::Vector3,pm::Vector3,pm::Vector3,pm::Vector3>
                     (world,&local_2e0,(Vector3 *)&local_2c0,(Vector3 *)&local_2d0,
                      (Vector3 *)&local_2f0);
  (pRVar3->super_Geometry).material_ = &pMVar2->super_Material;
  local_40.x = 130.0;
  local_40.y = 165.0;
  local_40.z = 65.0;
  local_50.x = 82.0;
  local_50.y = 165.0;
  local_50.z = 225.0;
  local_60 = 0x4325000043910000;
  local_58 = 0x42e40000;
  rectangleFromVertices(&local_2e0,&local_40,&local_50);
  local_270._M_head_impl = (Geometry *)local_2e0._0_8_;
  *(Matte **)(local_2e0._0_8_ + 0x10) = pMVar2;
  local_2e0.x = 0.0;
  local_2e0.y = 0.0;
  pm::World::addObject
            (world,(unique_ptr<pm::Geometry,_std::default_delete<pm::Geometry>_> *)&local_270);
  if (local_270._M_head_impl != (Geometry *)0x0) {
    (*(local_270._M_head_impl)->_vptr_Geometry[1])();
  }
  local_270._M_head_impl = (Geometry *)0x0;
  local_70.x = 290.0;
  local_70.y = 0.0;
  local_70.z = 114.0;
  local_80.x = 290.0;
  local_80.y = 165.0;
  local_80.z = 114.0;
  local_90 = 0x43700000;
  local_88 = 0x43880000;
  rectangleFromVertices((Vector3 *)&local_2c0,&local_70,&local_80);
  local_278._M_head_impl = local_2c0;
  local_2c0->material_ = &pMVar2->super_Material;
  local_2c0 = (Geometry *)0x0;
  pm::World::addObject
            (world,(unique_ptr<pm::Geometry,_std::default_delete<pm::Geometry>_> *)&local_278);
  if (local_278._M_head_impl != (Geometry *)0x0) {
    (*(local_278._M_head_impl)->_vptr_Geometry[1])();
  }
  local_278._M_head_impl = (Geometry *)0x0;
  local_a0.x = 130.0;
  local_a0.y = 0.0;
  local_a0.z = 65.0;
  local_b0.x = 130.0;
  local_b0.y = 165.0;
  local_b0.z = 65.0;
  local_c0 = 0x43910000;
  local_b8 = 0x42e40000;
  rectangleFromVertices((Vector3 *)&local_2d0,&local_a0,&local_b0);
  local_280._M_head_impl = local_2d0;
  local_2d0->material_ = &pMVar2->super_Material;
  local_2d0 = (Geometry *)0x0;
  pm::World::addObject
            (world,(unique_ptr<pm::Geometry,_std::default_delete<pm::Geometry>_> *)&local_280);
  if (local_280._M_head_impl != (Geometry *)0x0) {
    (*(local_280._M_head_impl)->_vptr_Geometry[1])();
  }
  local_280._M_head_impl = (Geometry *)0x0;
  local_d0.x = 82.0;
  local_d0.y = 0.0;
  local_d0.z = 225.0;
  local_e0.x = 82.0;
  local_e0.y = 165.0;
  local_e0.z = 225.0;
  local_f0 = 0x43020000;
  local_e8 = 0x42820000;
  rectangleFromVertices((Vector3 *)&local_2f0,&local_d0,&local_e0);
  local_288._M_head_impl = local_2f0;
  local_2f0->material_ = &pMVar2->super_Material;
  local_2f0 = (Geometry *)0x0;
  pm::World::addObject
            (world,(unique_ptr<pm::Geometry,_std::default_delete<pm::Geometry>_> *)&local_288);
  if (local_288._M_head_impl != (Geometry *)0x0) {
    (*(local_288._M_head_impl)->_vptr_Geometry[1])();
  }
  local_288._M_head_impl = (Geometry *)0x0;
  local_100.x = 240.0;
  local_100.y = 0.0;
  local_100.z = 272.0;
  local_110.x = 240.0;
  local_110.y = 165.0;
  local_110.z = 272.0;
  local_120 = 0x42a40000;
  local_118 = 0x43610000;
  rectangleFromVertices((Vector3 *)&local_250,&local_100,&local_110);
  local_290._M_head_impl = local_250;
  local_250->material_ = &pMVar2->super_Material;
  local_250 = (Geometry *)0x0;
  pm::World::addObject
            (world,(unique_ptr<pm::Geometry,_std::default_delete<pm::Geometry>_> *)&local_290);
  if (local_290._M_head_impl != (Geometry *)0x0) {
    (*(local_290._M_head_impl)->_vptr_Geometry[1])();
  }
  local_290._M_head_impl = (Geometry *)0x0;
  local_130.x = 423.0;
  local_130.y = 330.0;
  local_130.z = 247.0;
  local_140.x = 265.0;
  local_140.y = 330.0;
  local_140.z = 296.0;
  local_150 = 0x43a5000043ec0000;
  local_148 = 0x43cb0000;
  rectangleFromVertices((Vector3 *)&local_258,&local_130,&local_140);
  local_298._M_head_impl = local_258;
  local_258->material_ = &pMVar2->super_Material;
  local_258 = (Geometry *)0x0;
  pm::World::addObject
            (world,(unique_ptr<pm::Geometry,_std::default_delete<pm::Geometry>_> *)&local_298);
  if (local_298._M_head_impl != (Geometry *)0x0) {
    (*(local_298._M_head_impl)->_vptr_Geometry[1])();
  }
  local_298._M_head_impl = (Geometry *)0x0;
  local_160.x = 423.0;
  local_160.y = 0.0;
  local_160.z = 247.0;
  local_170.x = 423.0;
  local_170.y = 330.0;
  local_170.z = 247.0;
  local_180 = 0x43ec0000;
  local_178 = 0x43cb0000;
  rectangleFromVertices((Vector3 *)&local_218,&local_160,&local_170);
  local_218->material_ = &pMVar2->super_Material;
  local_2a0._M_head_impl = local_218;
  pm::World::addObject
            (world,(unique_ptr<pm::Geometry,_std::default_delete<pm::Geometry>_> *)&local_2a0);
  if (local_2a0._M_head_impl != (Geometry *)0x0) {
    (*(local_2a0._M_head_impl)->_vptr_Geometry[1])();
  }
  local_2a0._M_head_impl = (Geometry *)0x0;
  local_190.x = 472.0;
  local_190.y = 0.0;
  local_190.z = 406.0;
  local_1a0.x = 472.0;
  local_1a0.y = 330.0;
  local_1a0.z = 406.0;
  local_1b0 = 0x439d0000;
  local_1a8 = 0x43e40000;
  rectangleFromVertices((Vector3 *)&local_220,&local_190,&local_1a0);
  local_220->material_ = &pMVar2->super_Material;
  local_2a8._M_head_impl = local_220;
  pm::World::addObject
            (world,(unique_ptr<pm::Geometry,_std::default_delete<pm::Geometry>_> *)&local_2a8);
  if (local_2a8._M_head_impl != (Geometry *)0x0) {
    (*(local_2a8._M_head_impl)->_vptr_Geometry[1])();
  }
  local_2a8._M_head_impl = (Geometry *)0x0;
  local_1c0.x = 314.0;
  local_1c0.y = 0.0;
  local_1c0.z = 456.0;
  local_1d0.x = 314.0;
  local_1d0.y = 330.0;
  local_1d0.z = 456.0;
  local_1e0 = 0x43848000;
  local_1d8 = 0x43940000;
  rectangleFromVertices((Vector3 *)&local_228,&local_1c0,&local_1d0);
  local_228->material_ = &pMVar2->super_Material;
  local_2b0._M_head_impl = local_228;
  pm::World::addObject
            (world,(unique_ptr<pm::Geometry,_std::default_delete<pm::Geometry>_> *)&local_2b0);
  if (local_2b0._M_head_impl != (Geometry *)0x0) {
    (*(local_2b0._M_head_impl)->_vptr_Geometry[1])();
  }
  local_2b0._M_head_impl = (Geometry *)0x0;
  local_1f0.x = 265.0;
  local_1f0.y = 0.0;
  local_1f0.z = 296.0;
  local_200.x = 265.0;
  local_200.y = 330.0;
  local_200.z = 296.0;
  local_210 = 0x43d38000;
  local_208 = 0x43770000;
  rectangleFromVertices((Vector3 *)&local_230,&local_1f0,&local_200);
  local_230->material_ = &pMVar2->super_Material;
  local_260._M_head_impl = local_230;
  pm::World::addObject
            (world,(unique_ptr<pm::Geometry,_std::default_delete<pm::Geometry>_> *)&local_260);
  if (local_260._M_head_impl != (Geometry *)0x0) {
    (*(local_260._M_head_impl)->_vptr_Geometry[1])();
  }
  return;
}

Assistant:

void setupCornellBox(pm::World &world)
{
	auto vpSampler = world.createSampler<pm::MultiJittered>(9);

	world.viewPlane().setDimensions(Width, Height);
	world.viewPlane().setSampler(vpSampler);
	world.viewPlane().editMaxDepth() = 5;

	auto hammersley = world.createSampler<pm::Hammersley>(256);

	// Materials
	auto white = world.createMaterial<pm::Matte>();
	white->setCd(0.7f, 0.7f, 0.7f);
	white->ambient().setSampler(hammersley);
	white->diffuse().setSampler(hammersley);

	auto red = world.createMaterial<pm::Matte>();
	red->setCd(0.7f, 0.0f, 0.0f);
	red->ambient().setSampler(hammersley);
	red->diffuse().setSampler(hammersley);

	auto green = world.createMaterial<pm::Matte>();
	green->setCd(0.0f, 0.7f, 0.0f);
	green->ambient().setSampler(hammersley);
	green->diffuse().setSampler(hammersley);

	auto emissive = world.createMaterial<pm::Emissive>();

	// Light
	auto lightRect = world.createObject<pm::Rectangle>(pm::Vector3(213.0f, 548.79f, 227.0f), pm::Vector3(343.0f - 213.0f, 0.0f, 0.0f), pm::Vector3(0.0f, 0.0f, 332.0f - 227.0f), pm::Vector3(0.0f, -1.0f, 0.0f));
	lightRect->setSampler(hammersley);
	lightRect->setMaterial(emissive);

	// Walls
	auto floor = world.createObject<pm::Rectangle>(pm::Vector3(0.0f, 0.0f, 0.0f), pm::Vector3(552.8f, 0.0f, 0.0f), pm::Vector3(0.0f, 0.0f, 559.2f), pm::Vector3(0.0f, 1.0f, 0.0f));
	floor->setMaterial(white);

	auto ceiling = world.createObject<pm::Rectangle>(pm::Vector3(0.0f, 548.8f, 0.0f), pm::Vector3(556.0f, 0.0f, 0.0f), pm::Vector3(0.0f, 0.0f, 559.2f), pm::Vector3(0.0f, -1.0f, 0.0f));
	ceiling->setMaterial(white);

	auto leftWall = world.createObject<pm::Rectangle>(pm::Vector3(552.8f, 0.0f, 0.0f), pm::Vector3(0.0f, 548.8f, 0.0f), pm::Vector3(0.0f, 0.0f, 559.2f), pm::Vector3(-1.0f, 0.0f, 0.0f));
	leftWall->setMaterial(red);

	auto rightWall = world.createObject<pm::Rectangle>(pm::Vector3(0.0f, 0.0f, 0.0f), pm::Vector3(0.0f, 548.8f, 0.0f), pm::Vector3(0.0f, 0.0f, 559.2f), pm::Vector3(1.0f, 0.0f, 0.0f));
	rightWall->setMaterial(green);

	auto backWall = world.createObject<pm::Rectangle>(pm::Vector3(0.0f, 0.0f, 559.2f), pm::Vector3(0.0f, 548.8f, 0.0f), pm::Vector3(556.0f, 0.0f, 0.0f), pm::Vector3(0.0f, 0.0f, -1.0f));
	backWall->setMaterial(white);

	// Short object
	auto short1 = rectangleFromVertices(pm::Vector3(130.0f, 165.0f, 65.0f), pm::Vector3(82.0f, 165.0f, 225.0f), pm::Vector3(290.0f, 165.0f, 114.0f));
	short1->setMaterial(white);
	world.addObject(std::move(short1));

	auto short2 = rectangleFromVertices(pm::Vector3(290.0f, 0.0f, 114.0f), pm::Vector3(290.0f, 165.0f, 114.0f), pm::Vector3(240.0f, 0.0f, 272.0f));
	short2->setMaterial(white);
	world.addObject(std::move(short2));

	auto short3 = rectangleFromVertices(pm::Vector3(130.0f, 0.0f, 65.0f), pm::Vector3(130.0f, 165.0f, 65.0f), pm::Vector3(290.0f, 0.0f, 114.0f));
	short3->setMaterial(white);
	world.addObject(std::move(short3));

	auto short4 = rectangleFromVertices(pm::Vector3(82.0f, 0.0f, 225.0f), pm::Vector3(82.0f, 165.0f, 225.0f), pm::Vector3(130.0f, 0.0f, 65.0f));
	short4->setMaterial(white);
	world.addObject(std::move(short4));

	auto short5 = rectangleFromVertices(pm::Vector3(240.0f, 0.0f, 272.0f), pm::Vector3(240.0f, 165.0f, 272.0f), pm::Vector3(82.0f, 0.0f, 225.0f));
	short5->setMaterial(white);
	world.addObject(std::move(short5));

	// Tall object
	auto tall1 = rectangleFromVertices(pm::Vector3(423.0f, 330.0f, 247.0f), pm::Vector3(265.0f, 330.0f, 296.0f), pm::Vector3(472.0f, 330.0f, 406.0f));
	tall1->setMaterial(white);
	world.addObject(std::move(tall1));

	auto tall2 = rectangleFromVertices(pm::Vector3(423.0f, 0.0f, 247.0f), pm::Vector3(423.0f, 330.0f, 247.0f), pm::Vector3(472.0f, 0.0f, 406.0f));
	tall2->setMaterial(white);
	world.addObject(std::move(tall2));

	auto tall3 = rectangleFromVertices(pm::Vector3(472.0f, 0.0f, 406.0f), pm::Vector3(472.0f, 330.0f, 406.0f), pm::Vector3(314.0f, 0.0f, 456.0f));
	tall3->setMaterial(white);
	world.addObject(std::move(tall3));

	auto tall4 = rectangleFromVertices(pm::Vector3(314.0f, 0.0f, 456.0f), pm::Vector3(314.0f, 330.0f, 456.0f), pm::Vector3(265.0f, 0.0f, 296.0f));
	tall4->setMaterial(white);
	world.addObject(std::move(tall4));

	auto tall5 = rectangleFromVertices(pm::Vector3(265.0f, 0.0f, 296.0f), pm::Vector3(265.0f, 330.0f, 296.0f), pm::Vector3(423.0f, 0.0f, 247.0f));
	tall5->setMaterial(white);
	world.addObject(std::move(tall5));
}